

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_custom_notification.cxx
# Opt level: O2

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_custom_notification_req(raft_server *this,req_msg *req)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  ulong uVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> __args_3;
  element_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  ptr<resp_msg> pVar7;
  ptr<custom_notification_msg> msg_00;
  ptr<custom_notification_msg> msg_01;
  ptr<resp_msg> resp;
  ptr<custom_notification_msg> msg;
  ptr<log_entry> msg_le;
  ptr<buffer> buf;
  __shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2> local_e8;
  custom_notification_msg local_d0;
  __shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> local_a8;
  undefined4 local_94;
  __shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_b8._M_ptr = (element_type *)req[9].super_msg_base._vptr_msg_base[1];
  local_d0.type_ = 0x1d;
  __args_3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&req->log_entries_;
  local_94 = *(undefined4 *)
              ((long)&(in_RDX->ctx_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4);
  local_d0.ctx_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  local_a8._M_ptr = (element_type *)(**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
  std::make_shared<nuraft::resp_msg,unsigned_long,nuraft::msg_type,int&,int,unsigned_long>
            ((unsigned_long *)&local_e8,(msg_type *)&local_b8,(int *)&local_d0,(int *)__args_3._M_pi
             ,(unsigned_long *)&local_94);
  peVar3 = local_e8._M_ptr;
  uVar5 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
  _Var6._M_pi = local_e8._M_refcount._M_pi;
  peVar3->next_idx_ = uVar5;
  peVar3->accepted_ = true;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           in_RDX[2].ctx_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (in_RDX[2].ctx_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi == p_Var2) {
    local_e8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (local_d0.ctx_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_vptr__Sp_counted_base = (_func_int **)local_e8._M_ptr;
    (((enable_shared_from_this<nuraft::raft_server> *)
     &(local_d0.ctx_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count)->_M_weak_this).
    super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var6._M_pi;
    local_e8._M_ptr = (element_type *)0x0;
    _Var6._M_pi = local_d0.ctx_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    goto LAB_0012ffa3;
  }
  std::__shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_b8,(__shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2> *)p_Var2);
  std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_a8,
             &((local_b8._M_ptr)->buff_).
              super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>);
  _Var6._M_pi = local_d0.ctx_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  _Var4._M_pi = local_e8._M_refcount._M_pi;
  if (local_a8._M_ptr == (buffer *)0x0) {
    local_e8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (local_d0.ctx_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_vptr__Sp_counted_base = (_func_int **)local_e8._M_ptr;
    (((enable_shared_from_this<nuraft::raft_server> *)
     &(local_d0.ctx_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count)->_M_weak_this).
    super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var4._M_pi;
    local_e8._M_ptr = (element_type *)0x0;
  }
  else {
    custom_notification_msg::deserialize(&local_d0,local_a8._M_ptr);
    _Var4._M_pi = local_e8._M_refcount._M_pi;
    iVar1 = *(int *)CONCAT44(local_d0._4_4_,local_d0.type_);
    if (iVar1 == 1) {
      std::__shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,
                 (__shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_d0);
      std::__shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,&local_e8);
      handle_out_of_log_msg
                ((raft_server *)_Var6._M_pi,req,(ptr<custom_notification_msg> *)in_RDX,
                 (ptr<resp_msg> *)&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      this_00 = &local_40._M_refcount;
LAB_0012ff6b:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
    }
    else {
      if (iVar1 == 2) {
        std::__shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_60,
                   (__shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2> *)
                   &local_d0);
        std::__shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_70,&local_e8);
        msg_01.super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = __args_3._M_pi;
        msg_01.super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = in_RDX;
        handle_leadership_takeover((raft_server *)_Var6._M_pi,req,msg_01,(ptr<resp_msg> *)&local_70)
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
        this_00 = &local_60._M_refcount;
        goto LAB_0012ff6b;
      }
      if (iVar1 == 3) {
        std::__shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_80,
                   (__shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2> *)
                   &local_d0);
        std::__shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_90,&local_e8);
        msg_00.super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = __args_3._M_pi;
        msg_00.super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = in_RDX;
        handle_resignation_request((raft_server *)_Var6._M_pi,req,msg_00,(ptr<resp_msg> *)&local_90)
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
        this_00 = &local_80._M_refcount;
        goto LAB_0012ff6b;
      }
      local_e8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (_Var6._M_pi)->_vptr__Sp_counted_base = (_func_int **)local_e8._M_ptr;
      (((enable_shared_from_this<nuraft::raft_server> *)&(_Var6._M_pi)->_M_use_count)->_M_weak_this)
      .super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Var4._M_pi;
      local_e8._M_ptr = (element_type *)0x0;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d0.ctx_);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
LAB_0012ffa3:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
  pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var6._M_pi;
  return (ptr<resp_msg>)pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_custom_notification_req(req_msg& req) {
    ptr<resp_msg> resp = cs_new<resp_msg>( state_->get_term(),
                                           msg_type::custom_notification_response,
                                           id_,
                                           req.get_src(),
                                           log_store_->next_slot() );
    resp->accept(log_store_->next_slot());

    std::vector< ptr<log_entry> >& log_entries = req.log_entries();
    if (!log_entries.size()) {
        // Empty message, just return.
        return resp;
    }

    ptr<log_entry> msg_le = log_entries[0];
    ptr<buffer> buf = msg_le->get_buf_ptr();
    if (!buf) return resp;

    ptr<custom_notification_msg> msg = custom_notification_msg::deserialize(*buf);

    switch (msg->type_) {
    case custom_notification_msg::out_of_log_range_warning: {
        return handle_out_of_log_msg(req, msg, resp);
    }
    case custom_notification_msg::leadership_takeover: {
        return handle_leadership_takeover(req, msg, resp);
    }
    case custom_notification_msg::request_resignation: {
        return handle_resignation_request(req, msg, resp);
    }
    default:
        break;
    }

    return resp;
}